

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O3

NodeSequence __thiscall
GraphBuilder::insertPthreadExit(GraphBuilder *this,CallInst *callInstruction)

{
  long lVar1;
  CallNode *this_00;
  ReturnNode *this_01;
  Node *node;
  CallInst *callInst;
  NodeSequence NVar2;
  
  lVar1 = *(long *)(callInstruction + -0x20);
  if (((lVar1 == 0) || (*(char *)(lVar1 + 0x10) != '\0')) ||
     (*(long *)(lVar1 + 0x18) != *(long *)(callInstruction + 0x48))) {
    this_00 = (CallNode *)operator_new(0x80);
    callInst = callInstruction;
    callInstruction = (CallInst *)(Instruction *)0x0;
  }
  else {
    this_00 = (CallNode *)operator_new(0x80);
    callInst = (CallInst *)0x0;
  }
  CallNode::CallNode(this_00,(Instruction *)callInstruction,callInst);
  NVar2.first = &addNode<CallNode>(this,this_00)->super_Node;
  this_01 = (ReturnNode *)operator_new(0x80);
  ReturnNode::ReturnNode(this_01,(Instruction *)0x0);
  node = &addNode<ReturnNode>(this,this_01)->super_Node;
  Node::addSuccessor(NVar2.first,node);
  NVar2.second = node;
  return NVar2;
}

Assistant:

GraphBuilder::NodeSequence
GraphBuilder::insertPthreadExit(const CallInst *callInstruction) {
    CallNode *callNode;
    if (callInstruction->getCalledFunction()) {
        callNode = addNode(createNode<NodeType::CALL>(callInstruction));
    } else {
        callNode =
                addNode(createNode<NodeType::CALL>(nullptr, callInstruction));
    }
    auto *returnNode = addNode(createNode<NodeType::RETURN>());
    callNode->addSuccessor(returnNode);
    return {callNode, returnNode};
}